

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O1

int Abc_NtkTestScorrWriteEquivAig(Tst_Dat_t *pData)

{
  Abc_Ntk_t *pNetlist;
  Aig_Man_t *pAVar1;
  Vec_Int_t *vId2Name;
  int *piVar2;
  int iVar3;
  FILE *__stream;
  Vec_Ptr_t *pVVar4;
  char *pName;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  
  pNetlist = pData->pNetlist;
  pAVar1 = pData->pAig;
  vId2Name = pData->vId2Name;
  pName = pData->pFileNameOut;
  if (pData->fDumpBmc != 0) {
    pData->fDumpBmc = 0;
    Abc_NtkBmcFileName(pName);
    pName = Abc_NtkBmcFileName::Buffer;
  }
  __stream = fopen(pName,"wb");
  pVVar4 = pAVar1->vObjs;
  if (pVVar4->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar7 = 0;
    uVar5 = 0;
    do {
      piVar2 = (int *)pVVar4->pArray[lVar7];
      if (piVar2 != (int *)0x0) {
        if (pAVar1->pReprs == (Aig_Obj_t **)0x0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = pAVar1->pReprs[piVar2[9]];
        }
        if (pAVar6 != (Aig_Obj_t *)0x0) {
          if (pData->fFlopOnly == 0) {
            if ((pData->fFfNdOnly != 0) && (((piVar2[6] & 7U) != 2 || (*piVar2 < pAVar1->nTruePis)))
               ) goto LAB_0030f498;
LAB_0030f4b1:
            if (pAVar6 == pAVar1->pConst1) {
              iVar3 = Abc_NtkTestScorrWriteEquivConst
                                (pNetlist,vId2Name,piVar2[9],(FILE *)__stream,
                                 (uint)piVar2[6] >> 3 & 1);
            }
            else {
              iVar3 = Abc_NtkTestScorrWriteEquivPair
                                (pNetlist,vId2Name,pAVar6->Id,piVar2[9],(FILE *)__stream,
                                 (piVar2[6] ^ *(uint *)&pAVar6->field_0x18) >> 3 & 1);
            }
            uVar5 = uVar5 + iVar3;
          }
          else if (((piVar2[6] & 7U) == 2) && (pAVar1->nTruePis <= *piVar2)) {
LAB_0030f498:
            if ((((*(uint *)&pAVar6->field_0x18 & 7) == 2) &&
                (pAVar1->nTruePis <= (pAVar6->field_0).CioId)) || (pAVar6 == pAVar1->pConst1))
            goto LAB_0030f4b1;
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar4 = pAVar1->vObjs;
    } while (lVar7 < pVVar4->nSize);
  }
  fclose(__stream);
  printf("%d pairs of sequentially equivalent nodes are written into file \"%s\".\n",(ulong)uVar5,
         pName);
  return uVar5;
}

Assistant:

int Abc_NtkTestScorrWriteEquivAig( Tst_Dat_t * pData )
{
    Abc_Ntk_t * pNetlist = pData->pNetlist;
    Vec_Int_t * vId2Name = pData->vId2Name;
    Aig_Man_t * pAig     = pData->pAig;
    char * pFileNameOut  = pData->pFileNameOut;
    FILE * pFile;
    Aig_Obj_t * pObj, * pRepr;
    int i, Counter = 0;
    if ( pData->fDumpBmc )
    {
        pData->fDumpBmc = 0;
        pFileNameOut = Abc_NtkBmcFileName( pFileNameOut );
    }
    pFile = fopen( pFileNameOut, "wb" );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) == NULL )
            continue;
        if ( pData->fFlopOnly )
        {
            if ( !Saig_ObjIsLo(pAig, pObj) || !(Saig_ObjIsLo(pAig, pRepr)||pRepr==Aig_ManConst1(pAig)) )
                continue;
        }
        else if ( pData->fFfNdOnly )
        {
            if ( !Saig_ObjIsLo(pAig, pObj) && !(Saig_ObjIsLo(pAig, pRepr)||pRepr==Aig_ManConst1(pAig)) )
                continue;
        }
        if ( pRepr == Aig_ManConst1(pAig) )
            Counter += Abc_NtkTestScorrWriteEquivConst( pNetlist, vId2Name, Aig_ObjId(pObj), pFile, Aig_ObjPhase(pObj) );
        else
            Counter += Abc_NtkTestScorrWriteEquivPair( pNetlist, vId2Name, Aig_ObjId(pRepr), Aig_ObjId(pObj), pFile, 
                Aig_ObjPhase(pRepr) ^ Aig_ObjPhase(pObj) );
    }
    fclose( pFile );
    printf( "%d pairs of sequentially equivalent nodes are written into file \"%s\".\n", Counter, pFileNameOut );
    return Counter;
}